

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

OptBuilder __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::operator[]
          (CommandLine<Catch::ConfigData> *this,string *optName)

{
  long in_RSI;
  value_type *in_RDI;
  string *in_stack_000000c8;
  Arg *in_stack_000000d0;
  OptBuilder *builder;
  ArgBuilder this_00;
  
  this_00.m_arg = in_RDI;
  Arg::Arg((Arg *)(in_RSI + 8));
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::push_back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
               *)this_00.m_arg,in_RDI);
  Arg::~Arg(this_00.m_arg);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          *)this_00.m_arg);
  addOptName(in_stack_000000d0,in_stack_000000c8);
  std::
  vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
  ::back((vector<Catch::Clara::CommandLine<Catch::ConfigData>::Arg,_std::allocator<Catch::Clara::CommandLine<Catch::ConfigData>::Arg>_>
          *)this_00.m_arg);
  OptBuilder::OptBuilder((OptBuilder *)this_00.m_arg,in_RDI);
  return (OptBuilder)(ArgBuilder)this_00.m_arg;
}

Assistant:

OptBuilder operator[]( std::string const& optName ) {
            m_options.push_back( Arg() );
            addOptName( m_options.back(), optName );
            OptBuilder builder( &m_options.back() );
            return builder;
        }